

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Writer.cpp
# Opt level: O3

void __thiscall
adios2::core::engine::BP3Writer::AggregateWriteData(BP3Writer *this,bool isFinal,int transportIndex)

{
  BP3Serializer *this_00;
  BPBase *this_01;
  ExchangeRequests *__return_storage_ptr__;
  int iVar1;
  Buffer *pBVar2;
  undefined4 extraout_var;
  _func_int *p_Var3;
  int iVar4;
  BufferSTL *bufferSTL;
  ExchangeAbsolutePositionRequests absolutePositionRequests;
  ScopedTimer __var2389;
  ExchangeRequests dataRequests;
  undefined1 local_68 [40];
  Req local_40;
  Req local_38;
  
  if (AggregateWriteData(bool,int)::__var389 == '\0') {
    iVar4 = __cxa_guard_acquire(&AggregateWriteData(bool,int)::__var389);
    if (iVar4 != 0) {
      AggregateWriteData::__var389 = (void *)ps_timer_create_("BP3Writer::AggregateWriteData");
      __cxa_guard_release(&AggregateWriteData(bool,int)::__var389);
    }
  }
  local_68._24_8_ = AggregateWriteData::__var389;
  if (_perfstubs_initialized == 1) {
    ps_timer_start_();
  }
  this_00 = &this->m_BP3Serializer;
  adios2::format::BP3Serializer::CloseStream(this_00,(this->super_Engine).m_IO,false);
  p_Var3 = (this->m_BP3Serializer).super_BP3Base._vptr_BP3Base[-3];
  if (0 < *(int *)(p_Var3 + 0x324 + (long)&(this->m_BP3Serializer).super_BP3Base._vptr_BP3Base)) {
    local_68._16_8_ = &this->m_FileDataManager;
    iVar4 = 0;
    __return_storage_ptr__ = (ExchangeRequests *)(local_68 + 0x20);
    do {
      aggregator::MPIChain::IExchange
                (__return_storage_ptr__,
                 (MPIChain *)(&(this_00->super_BP3Base).field_0x2f8 + (long)p_Var3),
                 (Buffer *)
                 (p_Var3 + 0x30 + (long)&(this->m_BP3Serializer).super_BP3Base._vptr_BP3Base),iVar4)
      ;
      p_Var3 = (this_00->super_BP3Base)._vptr_BP3Base[-3];
      aggregator::MPIChain::IExchangeAbsolutePosition
                ((MPIChain *)local_68,
                 (Buffer *)(&(this_00->super_BP3Base).field_0x2f8 + (long)p_Var3),
                 (int)this + 0xf0 + (int)p_Var3);
      p_Var3 = (this_00->super_BP3Base)._vptr_BP3Base[-3];
      if ((p_Var3 + 0x328)[(long)&(this->m_BP3Serializer).super_BP3Base._vptr_BP3Base] ==
          (_func_int)0x1) {
        pBVar2 = aggregator::MPIChain::GetConsumerBuffer
                           ((MPIChain *)(&(this_00->super_BP3Base).field_0x2f8 + (long)p_Var3),
                            (Buffer *)(&(this_00->super_BP3Base).field_0x30 + (long)p_Var3));
        iVar1 = (*pBVar2->_vptr_Buffer[3])(pBVar2);
        transportman::TransportMan::WriteFiles
                  ((TransportMan *)local_68._16_8_,(char *)CONCAT44(extraout_var,iVar1),
                   pBVar2->m_Position,transportIndex);
        transportman::TransportMan::FlushFiles((TransportMan *)local_68._16_8_,transportIndex);
        p_Var3 = (this_00->super_BP3Base)._vptr_BP3Base[-3];
      }
      aggregator::MPIChain::WaitAbsolutePosition
                ((MPIChain *)
                 (p_Var3 + 0x2f8 + (long)&(this->m_BP3Serializer).super_BP3Base._vptr_BP3Base),
                 (ExchangeAbsolutePositionRequests *)local_68,iVar4);
      aggregator::MPIChain::Wait
                ((MPIChain *)
                 ((this_00->super_BP3Base)._vptr_BP3Base[-3] + 0x2f8 +
                 (long)&(this->m_BP3Serializer).super_BP3Base._vptr_BP3Base),__return_storage_ptr__,
                 iVar4);
      aggregator::MPIChain::SwapBuffers
                ((MPIChain *)
                 ((this->m_BP3Serializer).super_BP3Base._vptr_BP3Base[-3] + 0x2f8 +
                 (long)&(this->m_BP3Serializer).super_BP3Base._vptr_BP3Base),iVar4);
      helper::Comm::Req::~Req((Req *)(local_68 + 8));
      helper::Comm::Req::~Req((Req *)local_68);
      helper::Comm::Req::~Req(&local_38);
      helper::Comm::Req::~Req(&local_40);
      helper::Comm::Req::~Req((Req *)__return_storage_ptr__);
      iVar4 = iVar4 + 1;
      p_Var3 = (this->m_BP3Serializer).super_BP3Base._vptr_BP3Base[-3];
    } while (iVar4 < *(int *)(p_Var3 + 0x324 +
                             (long)&(this->m_BP3Serializer).super_BP3Base._vptr_BP3Base));
  }
  adios2::format::BPSerializer::UpdateOffsetsInMetadata
            ((BPSerializer *)&(this->m_BP3Serializer).super_BP3Base.field_0x8);
  if (isFinal) {
    p_Var3 = (this_00->super_BP3Base)._vptr_BP3Base[-3];
    this_01 = (BPBase *)((long)&(this_00->super_BP3Base)._vptr_BP3Base + (long)p_Var3);
    bufferSTL = (BufferSTL *)(&(this_00->super_BP3Base).field_0x30 + (long)p_Var3);
    adios2::format::BPBase::ResetBuffer(this_01,(Buffer *)bufferSTL,false,false);
    adios2::format::BP3Serializer::AggregateCollectiveMetadata
              (this_00,(Comm *)(&(this_00->super_BP3Base).field_0x318 +
                               (long)(this_00->super_BP3Base)._vptr_BP3Base[-3]),bufferSTL,false);
    p_Var3 = (this_00->super_BP3Base)._vptr_BP3Base[-3];
    if ((p_Var3 + 0x328)[(long)&(this->m_BP3Serializer).super_BP3Base._vptr_BP3Base] ==
        (_func_int)0x1) {
      transportman::TransportMan::WriteFiles
                (&this->m_FileDataManager,
                 (this_01->m_Data).m_Buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,(this_01->m_Data).super_Buffer.m_Position,
                 transportIndex);
      transportman::TransportMan::FlushFiles(&this->m_FileDataManager,transportIndex);
      p_Var3 = (this_00->super_BP3Base)._vptr_BP3Base[-3];
    }
    aggregator::MPIChain::Close((MPIChain *)(&(this_00->super_BP3Base).field_0x2f8 + (long)p_Var3));
  }
  aggregator::MPIChain::ResetBuffers
            ((MPIChain *)
             (&(this_00->super_BP3Base).field_0x2f8 +
             (long)(this_00->super_BP3Base)._vptr_BP3Base[-3]));
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer((ScopedTimer *)(local_68 + 0x18));
  return;
}

Assistant:

void BP3Writer::AggregateWriteData(const bool isFinal, const int transportIndex)
{
    PERFSTUBS_SCOPED_TIMER("BP3Writer::AggregateWriteData");
    m_BP3Serializer.CloseStream(m_IO, false);

    // async?
    for (int r = 0; r < m_BP3Serializer.m_Aggregator.m_Size; ++r)
    {
        aggregator::MPIChain::ExchangeRequests dataRequests =
            m_BP3Serializer.m_Aggregator.IExchange(m_BP3Serializer.m_Data, r);

        aggregator::MPIChain::ExchangeAbsolutePositionRequests absolutePositionRequests =
            m_BP3Serializer.m_Aggregator.IExchangeAbsolutePosition(m_BP3Serializer.m_Data, r);

        if (m_BP3Serializer.m_Aggregator.m_IsAggregator)
        {
            const format::Buffer &bufferSTL =
                m_BP3Serializer.m_Aggregator.GetConsumerBuffer(m_BP3Serializer.m_Data);

            m_FileDataManager.WriteFiles(bufferSTL.Data(), bufferSTL.m_Position, transportIndex);

            m_FileDataManager.FlushFiles(transportIndex);
        }

        m_BP3Serializer.m_Aggregator.WaitAbsolutePosition(absolutePositionRequests, r);

        m_BP3Serializer.m_Aggregator.Wait(dataRequests, r);
        m_BP3Serializer.m_Aggregator.SwapBuffers(r);
    }

    m_BP3Serializer.UpdateOffsetsInMetadata();

    if (isFinal) // Write metadata footer
    {
        format::BufferSTL &bufferSTL = m_BP3Serializer.m_Data;
        m_BP3Serializer.ResetBuffer(bufferSTL, false, false);

        m_BP3Serializer.AggregateCollectiveMetadata(m_BP3Serializer.m_Aggregator.m_Comm, bufferSTL,
                                                    false);

        if (m_BP3Serializer.m_Aggregator.m_IsAggregator)
        {
            m_FileDataManager.WriteFiles(bufferSTL.m_Buffer.data(), bufferSTL.m_Position,
                                         transportIndex);

            m_FileDataManager.FlushFiles(transportIndex);
        }

        m_BP3Serializer.m_Aggregator.Close();
    }

    m_BP3Serializer.m_Aggregator.ResetBuffers();
}